

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadBranchElimPass::FixPhiNodesInLiveBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  pointer puVar1;
  BasicBlock *pBVar2;
  uint **ppuVar3;
  IRContext *pIVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  spv_operand_type_t id;
  size_type sVar8;
  Operand *pOVar9;
  const_iterator cVar10;
  DefUseManager *pDVar11;
  Instruction *pIVar12;
  size_type sVar13;
  uint **ppuVar14;
  Instruction *extraout_RAX;
  bool bVar15;
  pointer puVar16;
  Instruction *this_00;
  uint32_t i;
  uint32_t uVar17;
  bool bVar18;
  undefined8 local_a8;
  BasicBlock *inc;
  initializer_list<unsigned_int> local_98;
  BasicBlock *local_88;
  undefined1 local_7c [4];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  
  puVar16 = (func->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8._4_4_ = 0;
  do {
    if (puVar16 == puVar1) {
      return (bool)((byte)local_a8._4_4_ & 1);
    }
    pBVar2 = (puVar16->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pBVar2;
    sVar8 = std::
            _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&live_blocks->_M_h,(key_type *)&operands);
    if (sVar8 != 0) {
      this_00 = *(Instruction **)
                 ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      local_88 = pBVar2;
      while ((this_00 !=
              (Instruction *)
              ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U) &&
             (this_00->opcode_ == OpPhi))) {
        operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar15 = false;
        pOVar9 = Instruction::GetOperand(this_00,0);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&operands,pOVar9);
        uVar17 = 1;
        pOVar9 = Instruction::GetOperand(this_00,1);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&operands,pOVar9);
        bVar18 = false;
        while( true ) {
          uVar7 = Instruction::NumInOperands(this_00);
          if (uVar7 <= uVar17) break;
          uVar7 = Instruction::GetSingleWordInOperand(this_00,uVar17);
          inc = GetParentBlock(this,uVar7);
          cVar10 = std::
                   _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&unreachable_continues->_M_h,&inc);
          if (((cVar10.
                super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                ._M_cur == (__node_type *)0x0) ||
              (*(BasicBlock **)
                ((long)cVar10.
                       super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                       ._M_cur + 0x10) != local_88)) ||
             (uVar7 = Instruction::NumInOperands(this_00), uVar7 < 5)) {
            sVar8 = std::
                    _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&live_blocks->_M_h,&inc);
            bVar5 = true;
            if ((sVar8 != 0) && (bVar6 = BasicBlock::IsSuccessor(inc,local_88), bVar6)) {
              pOVar9 = Instruction::GetInOperand(this_00,uVar17 - 1);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back(&operands,pOVar9);
              goto LAB_004a2e64;
            }
          }
          else {
            pDVar11 = Pass::get_def_use_mgr((Pass *)this);
            uVar7 = Instruction::GetSingleWordInOperand(this_00,uVar17 - 1);
            pIVar12 = analysis::DefUseManager::GetDef(pDVar11,uVar7);
            if (pIVar12->opcode_ == OpUndef) {
              pOVar9 = Instruction::GetInOperand(this_00,uVar17 - 1);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back(&operands,pOVar9);
              bVar15 = true;
            }
            else {
              local_a8._0_4_ = SPV_OPERAND_TYPE_ID;
              uVar7 = Instruction::type_id(this_00);
              local_7c = (undefined1  [4])MemPass::Type2Undef(&this->super_MemPass,uVar7);
              local_98._M_array = (iterator)local_7c;
              local_98._M_len = 1;
              std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
              emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                        ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                         &operands,(spv_operand_type_t *)&local_a8,&local_98);
              bVar15 = true;
              bVar18 = true;
            }
LAB_004a2e64:
            pOVar9 = Instruction::GetInOperand(this_00,uVar17);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                      (&operands,pOVar9);
            bVar5 = bVar18;
          }
          bVar18 = bVar5;
          uVar17 = uVar17 + 2;
        }
        if (bVar18) {
          id = BasicBlock::ContinueBlockIdIfAny(local_88);
          if (!bVar15 && id != SPV_OPERAND_TYPE_NONE) {
            local_98._M_array = (iterator)GetParentBlock(this,id);
            sVar13 = std::
                     _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count(&unreachable_continues->_M_h,(key_type *)&local_98);
            if ((sVar13 != 0) &&
               (4 < (ulong)(((long)operands.
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)operands.
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x30))) {
              inc = (BasicBlock *)CONCAT44(inc._4_4_,1);
              uVar17 = Instruction::type_id(this_00);
              local_a8._0_4_ = MemPass::Type2Undef(&this->super_MemPass,uVar17);
              local_98._M_len = 1;
              local_98._M_array = (iterator)&local_a8;
              std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
              emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                        ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                         &operands,(spv_operand_type_t *)&inc,&local_98);
              inc = (BasicBlock *)CONCAT44(inc._4_4_,1);
              local_98._M_len = 1;
              local_a8._0_4_ = id;
              local_98._M_array = (iterator)&local_a8;
              std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
              emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                        ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                         &operands,(spv_operand_type_t *)&inc,&local_98);
            }
          }
          if ((long)operands.
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)operands.
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0xc0) {
            ppuVar3 = (uint **)operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].words.large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar14 = &operands.
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].words.small_data_;
            if (ppuVar3 != (uint **)0x0) {
              ppuVar14 = ppuVar3;
            }
            uVar17 = **ppuVar14;
            pIVar4 = (this->super_MemPass).super_Pass.context_;
            uVar7 = Instruction::result_id(this_00);
            IRContext::KillNamesAndDecorates(pIVar4,uVar7);
            pIVar4 = (this->super_MemPass).super_Pass.context_;
            uVar7 = Instruction::result_id(this_00);
            IRContext::ReplaceAllUsesWith(pIVar4,uVar7,uVar17);
            pIVar12 = IRContext::KillInst((this->super_MemPass).super_Pass.context_,this_00);
            this_00 = pIVar12;
          }
          else {
            pDVar11 = Pass::get_def_use_mgr((Pass *)this);
            analysis::DefUseManager::EraseUseRecordsOfOperandIds(pDVar11,this_00);
            Instruction::ReplaceOperands(this_00,(OperandList *)&operands);
            pDVar11 = Pass::get_def_use_mgr((Pass *)this);
            analysis::DefUseManager::AnalyzeInstUse(pDVar11,this_00);
            this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            pIVar12 = extraout_RAX;
          }
          local_a8._4_4_ = (undefined4)CONCAT71((int7)((ulong)pIVar12 >> 8),1);
        }
        else {
          this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&operands);
      }
    }
    puVar16 = puVar16 + 1;
  } while( true );
}

Assistant:

bool DeadBranchElimPass::FixPhiNodesInLiveBlocks(
    Function* func, const std::unordered_set<BasicBlock*>& live_blocks,
    const std::unordered_map<BasicBlock*, BasicBlock*>& unreachable_continues) {
  bool modified = false;
  for (auto& block : *func) {
    if (live_blocks.count(&block)) {
      for (auto iter = block.begin(); iter != block.end();) {
        if (iter->opcode() != spv::Op::OpPhi) {
          break;
        }

        bool changed = false;
        bool backedge_added = false;
        Instruction* inst = &*iter;
        std::vector<Operand> operands;
        // Build a complete set of operands (not just input operands). Start
        // with type and result id operands.
        operands.push_back(inst->GetOperand(0u));
        operands.push_back(inst->GetOperand(1u));
        // Iterate through the incoming labels and determine which to keep
        // and/or modify.  If there in an unreachable continue block, there will
        // be an edge from that block to the header.  We need to keep it to
        // maintain the structured control flow.  If the header has more that 2
        // incoming edges, then the OpPhi must have an entry for that edge.
        // However, if there is only one other incoming edge, the OpPhi can be
        // eliminated.
        for (uint32_t i = 1; i < inst->NumInOperands(); i += 2) {
          BasicBlock* inc = GetParentBlock(inst->GetSingleWordInOperand(i));
          auto cont_iter = unreachable_continues.find(inc);
          if (cont_iter != unreachable_continues.end() &&
              cont_iter->second == &block && inst->NumInOperands() > 4) {
            if (get_def_use_mgr()
                    ->GetDef(inst->GetSingleWordInOperand(i - 1))
                    ->opcode() == spv::Op::OpUndef) {
              // Already undef incoming value, no change necessary.
              operands.push_back(inst->GetInOperand(i - 1));
              operands.push_back(inst->GetInOperand(i));
              backedge_added = true;
            } else {
              // Replace incoming value with undef if this phi exists in the
              // loop header. Otherwise, this edge is not live since the
              // unreachable continue block will be replaced with an
              // unconditional branch to the header only.
              operands.emplace_back(
                  SPV_OPERAND_TYPE_ID,
                  std::initializer_list<uint32_t>{Type2Undef(inst->type_id())});
              operands.push_back(inst->GetInOperand(i));
              changed = true;
              backedge_added = true;
            }
          } else if (live_blocks.count(inc) && inc->IsSuccessor(&block)) {
            // Keep live incoming edge.
            operands.push_back(inst->GetInOperand(i - 1));
            operands.push_back(inst->GetInOperand(i));
          } else {
            // Remove incoming edge.
            changed = true;
          }
        }

        if (changed) {
          modified = true;
          uint32_t continue_id = block.ContinueBlockIdIfAny();
          if (!backedge_added && continue_id != 0 &&
              unreachable_continues.count(GetParentBlock(continue_id)) &&
              operands.size() > 4) {
            // Changed the backedge to branch from the continue block instead
            // of a successor of the continue block. Add an entry to the phi to
            // provide an undef for the continue block. Since the successor of
            // the continue must also be unreachable (dominated by the continue
            // block), any entry for the original backedge has been removed
            // from the phi operands.
            operands.emplace_back(
                SPV_OPERAND_TYPE_ID,
                std::initializer_list<uint32_t>{Type2Undef(inst->type_id())});
            operands.emplace_back(SPV_OPERAND_TYPE_ID,
                                  std::initializer_list<uint32_t>{continue_id});
          }

          // Either replace the phi with a single value or rebuild the phi out
          // of |operands|.
          //
          // We always have type and result id operands. So this phi has a
          // single source if there are two more operands beyond those.
          if (operands.size() == 4) {
            // First input data operands is at index 2.
            uint32_t replId = operands[2u].words[0];
            context()->KillNamesAndDecorates(inst->result_id());
            context()->ReplaceAllUsesWith(inst->result_id(), replId);
            iter = context()->KillInst(&*inst);
          } else {
            // We've rewritten the operands, so first instruct the def/use
            // manager to forget uses in the phi before we replace them. After
            // replacing operands update the def/use manager by re-analyzing
            // the used ids in this phi.
            get_def_use_mgr()->EraseUseRecordsOfOperandIds(inst);
            inst->ReplaceOperands(operands);
            get_def_use_mgr()->AnalyzeInstUse(inst);
            ++iter;
          }
        } else {
          ++iter;
        }
      }
    }
  }

  return modified;
}